

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_segments(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  undefined4 local_44;
  curi_status tryStatus;
  size_t initialOffset;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  initialOffset._4_4_ = curi_status_success;
  while( true ) {
    sVar1 = *offset;
    local_44 = parse_char('/',uri,len,offset,settings,userData);
    if (local_44 == curi_status_success) {
      local_44 = parse_segment(uri,len,offset,settings,userData,0);
    }
    if (local_44 == curi_status_error) break;
    initialOffset._4_4_ = local_44;
  }
  *offset = sVar1;
  return initialOffset._4_4_;
}

Assistant:

static curi_status parse_segments(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // segments  = *( "/" segment )
    curi_status status = curi_status_success;

    for ( ; ; )
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_success;

        if (tryStatus == curi_status_success)
            tryStatus = parse_char('/', uri, len, offset, settings, userData);

        if (tryStatus == curi_status_success)
            tryStatus = parse_segment(uri, len, offset, settings, userData, 0);

        if (tryStatus == curi_status_error)
        {
            *offset = initialOffset;
            break;
        }
        else
            status = tryStatus;
    }

    return status;
}